

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpGCTest_Collect_TableCycle_Test::InterpGCTest_Collect_TableCycle_Test
          (InterpGCTest_Collect_TableCycle_Test *this)

{
  Features local_18;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_002c5990;
  local_18.exceptions_enabled_ = false;
  local_18.mutable_globals_enabled_ = true;
  local_18.sat_float_to_int_enabled_ = true;
  local_18.sign_extension_enabled_ = true;
  local_18.simd_enabled_ = false;
  local_18.threads_enabled_ = false;
  local_18.multi_value_enabled_ = true;
  local_18.gc_enabled_ = false;
  local_18.memory64_enabled_ = false;
  local_18.tail_call_enabled_ = false;
  local_18.bulk_memory_enabled_ = false;
  local_18.reference_types_enabled_ = false;
  local_18.annotations_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpGCTest).super_InterpTest.store_,&local_18);
  memset(&(this->super_InterpGCTest).super_InterpTest.module_desc_,0,0x150);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_002c5740;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::ExternRef, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}